

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl-client.c
# Opt level: O1

int lws_tls_client_confirm_peer_cert(lws *wsi,char *ebuf,size_t ebuf_len)

{
  uchar *buf;
  int *piVar1;
  ulong e;
  char *pcVar2;
  char *pcVar3;
  uint uVar4;
  int iVar5;
  
  buf = ((wsi->a).context)->pt[wsi->tsi].serv_buf;
  piVar1 = __errno_location();
  *piVar1 = 0;
  ERR_clear_error();
  e = SSL_get_verify_result((SSL *)(wsi->tls).ssl);
  pcVar3 = "";
  uVar4 = 0;
  if ((long)e < 0x12) {
    if (e == 0) {
      return 0;
    }
    if (e == 9) {
      pcVar3 = "tls=notyetvalid";
    }
    else {
      if (e != 10) goto LAB_0013738e;
      pcVar3 = "tls=expired";
    }
    uVar4 = 8;
  }
  else if ((e - 0x12 < 2) || (e == 0x4f)) {
    pcVar3 = "tls=invalidca";
    uVar4 = 2;
  }
  else {
    uVar4 = 0;
    if (e == 0x3e) {
      pcVar3 = "tls=hostname";
      uVar4 = 4;
    }
  }
LAB_0013738e:
  iVar5 = 0;
  _lws_log(8,"%s: cert problem: %s\n","lws_tls_client_confirm_peer_cert",pcVar3);
  if (((wsi->tls).use_ssl & uVar4) == 0) {
    pcVar2 = ERR_error_string(e,(char *)buf);
    lws_snprintf(ebuf,ebuf_len,"server\'s cert didn\'t look good, %s X509_V_ERR = %ld: %s\n",pcVar3,
                 e,pcVar2);
    _lws_log(8,"%s\n",ebuf);
    lws_tls_err_describe_clear();
    iVar5 = -1;
  }
  else {
    _lws_log(8,"%s: allowing anyway\n","lws_tls_client_confirm_peer_cert");
  }
  return iVar5;
}

Assistant:

int
lws_tls_client_confirm_peer_cert(struct lws *wsi, char *ebuf, size_t ebuf_len)
{
#if !defined(USE_WOLFSSL)
	struct lws_context_per_thread *pt = &wsi->a.context->pt[(int)wsi->tsi];
	char *p = (char *)&pt->serv_buf[0];
	const char *es, *type = "";
	unsigned int avoid = 0;
	char *sb = p;
	long n;

	errno = 0;
	ERR_clear_error();
	n = SSL_get_verify_result(wsi->tls.ssl);

	switch (n) {
	case X509_V_OK:
		return 0;

	case X509_V_ERR_HOSTNAME_MISMATCH:
		type = "tls=hostname";
		avoid = LCCSCF_SKIP_SERVER_CERT_HOSTNAME_CHECK;
		break;

	case X509_V_ERR_INVALID_CA:
	case X509_V_ERR_DEPTH_ZERO_SELF_SIGNED_CERT:
	case X509_V_ERR_SELF_SIGNED_CERT_IN_CHAIN:
		type = "tls=invalidca";
		avoid = LCCSCF_ALLOW_SELFSIGNED;
		break;

	case X509_V_ERR_CERT_NOT_YET_VALID:
		type = "tls=notyetvalid";
		avoid = LCCSCF_ALLOW_EXPIRED;
		break;

	case X509_V_ERR_CERT_HAS_EXPIRED:
		type = "tls=expired";
		avoid = LCCSCF_ALLOW_EXPIRED;
		break;
	}

	lwsl_info("%s: cert problem: %s\n", __func__, type);

#if defined(LWS_WITH_SYS_METRICS)
	lws_metrics_hist_bump_describe_wsi(wsi,
			lws_metrics_priv_to_pub(wsi->a.context->mth_conn_failures), type);
#endif

	if (wsi->tls.use_ssl & avoid) {
		lwsl_info("%s: allowing anyway\n", __func__);

		return 0;
	}

	es = ERR_error_string(
	#if defined(LWS_WITH_BORINGSSL)
					 (uint32_t)
	#else
					 (unsigned long)
	#endif
					 n, sb);
	lws_snprintf(ebuf, ebuf_len,
		"server's cert didn't look good, %s X509_V_ERR = %ld: %s\n",
		 type, n, es);
	lwsl_info("%s\n", ebuf);
	lws_tls_err_describe_clear();

	return -1;

#else /* USE_WOLFSSL */
	return 0;
#endif
}